

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstm.cpp
# Opt level: O1

int ncnn::lstm_int8(Mat *bottom_blob,Mat *top_blob,int reverse,Mat *weight_xc_int8,
                   float *weight_xc_int8_scales,Mat *bias_c,Mat *weight_hc_int8,
                   float *weight_hc_int8_scales,Mat *weight_hr,Mat *hidden_state,Mat *cell_state,
                   Option *opt)

{
  undefined4 uVar1;
  undefined1 uVar2;
  undefined1 uVar3;
  undefined1 uVar4;
  undefined1 uVar5;
  undefined1 uVar6;
  undefined1 uVar8;
  undefined1 uVar10;
  undefined1 uVar12;
  undefined1 uVar14;
  undefined1 uVar16;
  undefined1 uVar18;
  undefined1 uVar20;
  uint _w;
  uint _w_00;
  uint _h;
  size_t sVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [14];
  undefined1 auVar24 [14];
  undefined1 auVar25 [14];
  undefined1 auVar26 [14];
  undefined4 uVar27;
  undefined1 uVar28;
  undefined1 uVar30;
  undefined1 uVar32;
  undefined1 uVar34;
  undefined4 uVar35;
  undefined1 uVar36;
  undefined1 uVar38;
  undefined1 uVar40;
  undefined1 uVar42;
  int *piVar43;
  undefined1 auVar44 [14];
  undefined1 auVar45 [14];
  uint uVar46;
  void *pvVar47;
  long lVar48;
  long lVar49;
  void *pvVar50;
  ulong uVar51;
  ulong uVar52;
  ulong uVar53;
  void *pvVar54;
  void *pvVar55;
  ulong uVar56;
  void *pvVar57;
  ulong uVar58;
  long lVar59;
  void *pvVar60;
  ulong uVar61;
  void *pvVar62;
  long lVar63;
  ulong uVar64;
  void *pvVar65;
  void *pvVar66;
  void *pvVar67;
  float *pfVar68;
  int iVar69;
  int iVar70;
  float fVar71;
  float fVar72;
  float fVar74;
  float fVar75;
  float fVar76;
  undefined1 auVar73 [16];
  float fVar77;
  float fVar78;
  int iVar80;
  float fVar81;
  int iVar82;
  float fVar83;
  int iVar84;
  float fVar85;
  undefined1 auVar79 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  Option opt_quant;
  Option opt_quant_1;
  Mat local_288;
  Mat local_238;
  Mat local_1e8;
  Mat local_198;
  Mat local_148;
  Mat local_f8;
  Mat *local_b0;
  Mat *local_a8;
  ulong local_a0;
  Mat *local_98;
  ulong local_90;
  float *local_88;
  void *local_80;
  undefined1 local_78 [72];
  undefined1 auVar93 [12];
  undefined8 uVar7;
  undefined7 uVar9;
  undefined6 uVar11;
  undefined5 uVar13;
  undefined4 uVar15;
  undefined3 uVar17;
  undefined2 uVar19;
  undefined4 uVar29;
  undefined3 uVar31;
  undefined2 uVar33;
  undefined4 uVar37;
  undefined3 uVar39;
  undefined2 uVar41;
  
  _w = bottom_blob->w;
  uVar46 = bottom_blob->h;
  _w_00 = top_blob->w;
  uVar51 = (ulong)_w_00;
  _h = cell_state->w;
  uVar56 = (ulong)_h;
  local_288.cstep = 0;
  local_288.data = (void *)0x0;
  local_288.refcount._0_4_ = 0;
  local_288.refcount._4_4_ = 0;
  local_288.elemsize._0_4_ = 0;
  local_288.elemsize._4_4_ = 0;
  local_288.elempack = 0;
  local_288.allocator = (Allocator *)0x0;
  local_288.dims = 0;
  local_288.w = 0;
  local_288.h = 0;
  local_288.d = 0;
  local_288.c = 0;
  local_b0 = weight_xc_int8;
  local_a8 = bias_c;
  local_98 = top_blob;
  local_88 = weight_xc_int8_scales;
  Mat::create(&local_288,4,_h,4,opt->workspace_allocator);
  iVar69 = -100;
  if ((local_288.data == (void *)0x0) || ((long)local_288.c * local_288.cstep == 0))
  goto LAB_00374af4;
  local_1e8.cstep = 0;
  local_1e8.data = (void *)0x0;
  local_1e8.refcount._0_4_ = 0;
  local_1e8.refcount._4_4_ = 0;
  local_1e8.elemsize._0_4_ = 0;
  local_1e8._20_8_ = 0;
  local_1e8.allocator = (Allocator *)0x0;
  local_1e8.dims = 0;
  local_1e8.w = 0;
  local_1e8.h = 0;
  local_1e8.d = 0;
  local_1e8.c = 0;
  if (_w_00 == _h) {
LAB_00374087:
    local_148.cstep = 0;
    local_148.data = (void *)0x0;
    local_148.refcount._0_4_ = 0;
    local_148.refcount._4_4_ = 0;
    local_148.elemsize._0_4_ = 0;
    local_148.elemsize._4_4_ = 0;
    local_148.elempack = 0;
    local_148.allocator = (Allocator *)0x0;
    local_148.dims = 0;
    local_148.w = 0;
    local_148.h = 0;
    local_148.d = 0;
    local_148.c = 0;
    Mat::create(&local_148,_w,uVar46,1,1,opt->workspace_allocator);
    local_f8.cstep = 0;
    local_f8.data = (void *)0x0;
    local_f8.refcount._0_4_ = 0;
    local_f8.refcount._4_4_ = 0;
    local_f8.elemsize._0_4_ = 0;
    local_f8._20_8_ = 0;
    local_f8.allocator = (Allocator *)0x0;
    local_f8.dims = 0;
    local_f8.w = 0;
    local_f8.h = 0;
    local_f8.d = 0;
    local_f8.c = 0;
    Mat::create(&local_f8,uVar46,4,1,opt->workspace_allocator);
    if (0 < (int)uVar46) {
      pvVar47 = bottom_blob->data;
      iVar69 = bottom_blob->w;
      sVar21 = bottom_blob->elemsize;
      uVar58 = 0;
      do {
        fVar71 = 0.0;
        if (0 < (int)_w) {
          uVar61 = 0;
          do {
            fVar77 = ABS(*(float *)((long)pvVar47 + uVar61 * 4));
            if (fVar71 <= fVar77) {
              fVar71 = fVar77;
            }
            uVar61 = uVar61 + 1;
          } while (_w != uVar61);
        }
        *(float *)((long)local_f8.data + uVar58 * 4) = 127.0 / fVar71;
        uVar58 = uVar58 + 1;
        pvVar47 = (void *)((long)pvVar47 + (long)iVar69 * sVar21);
      } while (uVar58 != uVar46);
    }
    local_238.data = *(void **)opt;
    uVar27 = opt->openmp_blocktime;
    uVar28 = opt->use_winograd_convolution;
    uVar30 = opt->use_sgemm_convolution;
    uVar32 = opt->use_int8_inference;
    uVar34 = opt->use_vulkan_compute;
    uVar33 = CONCAT11(uVar34,uVar32);
    uVar31 = CONCAT21(uVar33,uVar30);
    uVar29 = CONCAT31(uVar31,uVar28);
    uVar58._0_1_ = opt->use_bf16_storage;
    uVar58._1_1_ = opt->use_fp16_packed;
    uVar58._2_1_ = opt->use_fp16_storage;
    uVar58._3_1_ = opt->use_fp16_arithmetic;
    uVar58._4_1_ = opt->use_int8_packed;
    uVar58._5_1_ = opt->use_int8_storage;
    uVar58._6_1_ = opt->use_int8_arithmetic;
    uVar58._7_1_ = opt->use_packing_layout;
    uVar35 = opt->vulkan_device_index;
    uVar36 = opt->use_reserved_1;
    uVar38 = opt->use_image_storage;
    uVar40 = opt->use_tensor_storage;
    uVar42 = opt->use_reserved_2;
    uVar41 = CONCAT11(uVar42,uVar40);
    uVar39 = CONCAT21(uVar41,uVar38);
    uVar37 = CONCAT31(uVar39,uVar36);
    uVar1 = opt->flush_denormals;
    uVar2 = opt->use_local_pool_allocator;
    uVar3 = opt->use_shader_local_memory;
    uVar4 = opt->use_cooperative_matrix;
    uVar5 = opt->use_winograd23_convolution;
    uVar6 = opt->use_winograd43_convolution;
    uVar8 = opt->use_winograd63_convolution;
    uVar10 = opt->use_a53_a55_optimized_kernel;
    uVar12 = opt->use_fp16_uniform;
    uVar14 = opt->use_int8_uniform;
    uVar16 = opt->use_reserved_9;
    uVar18 = opt->use_reserved_10;
    uVar20 = opt->use_reserved_11;
    uVar19 = CONCAT11(uVar20,uVar18);
    uVar17 = CONCAT21(uVar19,uVar16);
    uVar15 = CONCAT31(uVar17,uVar14);
    uVar13 = CONCAT41(uVar15,uVar12);
    uVar11 = CONCAT51(uVar13,uVar10);
    uVar9 = CONCAT61(uVar11,uVar8);
    uVar7 = CONCAT71(uVar9,uVar6);
    auVar93._4_8_ = uVar7;
    auVar93[3] = uVar5;
    auVar93[2] = uVar4;
    auVar93[1] = uVar3;
    auVar93[0] = uVar2;
    local_238.d = auVar93._0_4_;
    local_238.c = (int)uVar7;
    local_238.elemsize._0_4_ = SUB84(opt->workspace_allocator,0);
    local_238.elemsize._4_4_ = (undefined4)((ulong)opt->workspace_allocator >> 0x20);
    local_238.refcount._0_4_ = SUB84(opt->workspace_allocator,0);
    local_238.refcount._4_4_ = (undefined4)((ulong)opt->workspace_allocator >> 0x20);
    local_238.allocator = (Allocator *)(uVar58 & 0xffffffffffffff);
    local_238.elempack = uVar27;
    local_238._28_4_ = uVar29;
    local_238.dims = uVar35;
    local_238.w = uVar37;
    local_238.h = uVar1;
    local_238._60_4_ = uVar15;
    quantize_to_int8(bottom_blob,&local_148,&local_f8,(Option *)&local_238);
    local_238.cstep = 0;
    local_238.data = (void *)0x0;
    local_238.refcount._0_4_ = 0;
    local_238.refcount._4_4_ = 0;
    local_238.elemsize._0_4_ = 0;
    local_238.elemsize._4_4_ = 0;
    local_238.elempack = 0;
    local_238.allocator = (Allocator *)0x0;
    local_238.dims = 0;
    local_238.w = 0;
    local_238.h = 0;
    local_238.d = 0;
    local_238.c = 0;
    Mat::create(&local_238,_w_00,1,1,opt->workspace_allocator);
    local_198.cstep = 0;
    local_198.data = (float *)0x0;
    local_198.refcount._0_4_ = 0;
    local_198.refcount._4_4_ = 0;
    local_198.elemsize._0_4_ = 0;
    local_198._20_8_ = 0;
    local_198.allocator = (Allocator *)0x0;
    local_198.dims = 0;
    local_198.w = 0;
    local_198.h = 0;
    local_198.d = 0;
    local_198.c = 0;
    Mat::create(&local_198,1,4,1,opt->workspace_allocator);
    if (0 < (int)uVar46) {
      uVar61 = (ulong)(_h * 2);
      uVar52 = (ulong)(_h * 3);
      uVar58 = 0;
      local_a0 = (ulong)uVar46;
      do {
        uVar64 = (ulong)(~(uint)uVar58 + (int)local_a0);
        if (reverse == 0) {
          uVar64 = uVar58;
        }
        fVar71 = 0.0;
        if (0 < (int)_w_00) {
          uVar53 = 0;
          do {
            fVar77 = ABS(*(float *)((long)hidden_state->data + uVar53 * 4));
            if (fVar71 <= fVar77) {
              fVar71 = fVar77;
            }
            uVar53 = uVar53 + 1;
          } while (uVar51 != uVar53);
        }
        local_90 = uVar58;
        if (fVar71 == 0.0) {
          *(float *)local_198.data = 1.0;
          if (0 < local_238.c * (int)local_238.cstep) {
            memset(local_238.data,0,(ulong)(uint)(local_238.c * (int)local_238.cstep));
          }
        }
        else {
          *(float *)local_198.data = 127.0 / fVar71;
          local_78[0] = opt->lightmode;
          local_78[1] = opt->use_shader_pack8;
          local_78[2] = opt->use_subgroup_ops;
          local_78[3] = opt->use_reserved_0;
          local_78._4_4_ = opt->num_threads;
          local_78._16_8_ = opt->workspace_allocator;
          local_78._24_4_ = opt->openmp_blocktime;
          local_78[0x1c] = opt->use_winograd_convolution;
          local_78[0x1d] = opt->use_sgemm_convolution;
          local_78[0x1e] = opt->use_int8_inference;
          local_78[0x1f] = opt->use_vulkan_compute;
          local_78[0x20] = opt->use_bf16_storage;
          local_78[0x21] = opt->use_fp16_packed;
          local_78[0x22] = opt->use_fp16_storage;
          local_78[0x23] = opt->use_fp16_arithmetic;
          uVar46._0_1_ = opt->use_int8_packed;
          uVar46._1_1_ = opt->use_int8_storage;
          uVar46._2_1_ = opt->use_int8_arithmetic;
          uVar46._3_1_ = opt->use_packing_layout;
          local_78._40_4_ = opt->vulkan_device_index;
          local_78[0x2c] = opt->use_reserved_1;
          local_78[0x2d] = opt->use_image_storage;
          local_78[0x2e] = opt->use_tensor_storage;
          local_78[0x2f] = opt->use_reserved_2;
          local_78._48_4_ = opt->flush_denormals;
          local_78[0x34] = opt->use_local_pool_allocator;
          local_78[0x35] = opt->use_shader_local_memory;
          local_78[0x36] = opt->use_cooperative_matrix;
          local_78[0x37] = opt->use_winograd23_convolution;
          local_78[0x38] = opt->use_winograd43_convolution;
          local_78[0x39] = opt->use_winograd63_convolution;
          local_78[0x3a] = opt->use_a53_a55_optimized_kernel;
          local_78[0x3b] = opt->use_fp16_uniform;
          local_78[0x3c] = opt->use_int8_uniform;
          local_78[0x3d] = opt->use_reserved_9;
          local_78[0x3e] = opt->use_reserved_10;
          local_78[0x3f] = opt->use_reserved_11;
          local_78._8_8_ = opt->workspace_allocator;
          local_78._36_4_ = uVar46 & 0xffffff;
          quantize_to_int8(hidden_state,&local_238,&local_198,(Option *)local_78);
        }
        pvVar47 = local_1e8.data;
        lVar48 = (long)(int)uVar64;
        if (0 < (int)_h) {
          fVar71 = 1.0 / *local_198.data;
          fVar77 = 1.0 / *(float *)((long)local_f8.data + lVar48 * 4);
          pvVar54 = local_a8->data;
          lVar49 = (long)local_a8->w * local_a8->elemsize;
          pvVar65 = local_b0->data;
          pvVar50 = weight_hc_int8->data;
          lVar59 = (long)local_b0->w * local_b0->elemsize;
          pvVar66 = (void *)(lVar59 * uVar52 + (long)pvVar65);
          pvVar67 = (void *)(lVar59 * uVar61 + (long)pvVar65);
          pvVar60 = (void *)(lVar59 * uVar56 + (long)pvVar65);
          lVar63 = (long)weight_hc_int8->w * weight_hc_int8->elemsize;
          pvVar57 = (void *)(lVar63 * uVar52 + (long)pvVar50);
          pvVar62 = (void *)(lVar63 * uVar61 + (long)pvVar50);
          pvVar55 = (void *)(lVar63 * uVar56 + (long)pvVar50);
          local_80 = local_288.data;
          uVar58 = 0;
          do {
            fVar78 = 0.0;
            fVar81 = 0.0;
            fVar83 = 0.0;
            fVar85 = 0.0;
            fVar72 = 0.0;
            fVar74 = 0.0;
            fVar75 = 0.0;
            fVar76 = 0.0;
            if (0 < (int)_w) {
              uVar64 = 0;
              do {
                iVar69 = (int)*(char *)((long)local_148.data +
                                       uVar64 + local_148.w * lVar48 *
                                                CONCAT44(local_148.elemsize._4_4_,
                                                         (undefined4)local_148.elemsize));
                auVar90._4_4_ = iVar69;
                auVar90._0_4_ = iVar69;
                auVar90._8_4_ = iVar69;
                auVar90._12_4_ = iVar69;
                auVar88._8_8_ = 0;
                auVar88._0_8_ =
                     (ulong)((uint)*(byte *)((long)pvVar65 + uVar64) << 8 |
                            (uint)*(byte *)((long)pvVar60 + uVar64) << 0x18) |
                     (ulong)*(byte *)((long)pvVar67 + uVar64) << 0x28 |
                     (ulong)*(byte *)((long)pvVar66 + uVar64) << 0x38;
                auVar88 = psraw(auVar88,8);
                auVar23._10_2_ = 0;
                auVar23._0_10_ = auVar88._0_10_;
                auVar23._12_2_ = auVar88._6_2_;
                auVar25._8_2_ = auVar88._4_2_;
                auVar25._0_8_ = auVar88._0_8_;
                auVar25._10_4_ = auVar23._10_4_;
                auVar44._6_8_ = 0;
                auVar44._0_6_ = auVar25._8_6_;
                auVar89._6_8_ = SUB148(auVar44 << 0x40,6);
                auVar89._4_2_ = auVar88._2_2_;
                auVar89._0_2_ = auVar88._0_2_;
                auVar89._2_2_ = 0;
                auVar89._14_2_ = 0;
                auVar90 = pmaddwd(auVar89,auVar90);
                fVar72 = (float)((int)fVar72 + auVar90._0_4_);
                fVar74 = (float)((int)fVar74 + auVar90._4_4_);
                fVar75 = (float)((int)fVar75 + auVar90._8_4_);
                fVar76 = (float)((int)fVar76 + auVar90._12_4_);
                uVar64 = uVar64 + 1;
              } while (_w != uVar64);
              fVar72 = (float)(int)fVar72;
              fVar74 = (float)(int)fVar74;
              fVar75 = (float)(int)fVar75;
              fVar76 = (float)(int)fVar76;
            }
            if (0 < (int)_w_00) {
              iVar69 = 0;
              iVar80 = 0;
              iVar82 = 0;
              iVar84 = 0;
              uVar64 = 0;
              do {
                iVar70 = (int)*(char *)((long)local_238.data + uVar64);
                auVar86._4_4_ = iVar70;
                auVar86._0_4_ = iVar70;
                auVar86._8_4_ = iVar70;
                auVar86._12_4_ = iVar70;
                auVar91._8_8_ = 0;
                auVar91._0_8_ =
                     (ulong)((uint)*(byte *)((long)pvVar50 + uVar64) << 8 |
                            (uint)*(byte *)((long)pvVar55 + uVar64) << 0x18) |
                     (ulong)*(byte *)((long)pvVar62 + uVar64) << 0x28 |
                     (ulong)*(byte *)((long)pvVar57 + uVar64) << 0x38;
                auVar90 = psraw(auVar91,8);
                auVar24._10_2_ = 0;
                auVar24._0_10_ = auVar90._0_10_;
                auVar24._12_2_ = auVar90._6_2_;
                auVar26._8_2_ = auVar90._4_2_;
                auVar26._0_8_ = auVar90._0_8_;
                auVar26._10_4_ = auVar24._10_4_;
                auVar45._6_8_ = 0;
                auVar45._0_6_ = auVar26._8_6_;
                auVar92._6_8_ = SUB148(auVar45 << 0x40,6);
                auVar92._4_2_ = auVar90._2_2_;
                auVar92._0_2_ = auVar90._0_2_;
                auVar92._2_2_ = 0;
                auVar92._14_2_ = 0;
                auVar90 = pmaddwd(auVar92,auVar86);
                iVar69 = iVar69 + auVar90._0_4_;
                iVar80 = iVar80 + auVar90._4_4_;
                iVar82 = iVar82 + auVar90._8_4_;
                iVar84 = iVar84 + auVar90._12_4_;
                uVar64 = uVar64 + 1;
              } while (uVar51 != uVar64);
              fVar78 = (float)iVar69;
              fVar81 = (float)iVar80;
              fVar83 = (float)iVar82;
              fVar85 = (float)iVar84;
            }
            auVar79._0_4_ = fVar78 * fVar71;
            auVar79._4_4_ = fVar81 * fVar71;
            auVar79._8_4_ = fVar83 * fVar71;
            auVar79._12_4_ = fVar85 * fVar71;
            auVar87._4_4_ = weight_hc_int8_scales[uVar58 + uVar56];
            auVar87._0_4_ = weight_hc_int8_scales[uVar58];
            auVar87._12_4_ = weight_hc_int8_scales[uVar58 + uVar52];
            auVar87._8_4_ = weight_hc_int8_scales[uVar61 + uVar58];
            auVar88 = divps(auVar79,auVar87);
            auVar73._0_4_ = fVar72 * fVar77;
            auVar73._4_4_ = fVar74 * fVar77;
            auVar73._8_4_ = fVar75 * fVar77;
            auVar73._12_4_ = fVar76 * fVar77;
            auVar22._4_4_ = local_88[uVar58 + uVar56];
            auVar22._0_4_ = local_88[uVar58];
            auVar22._8_4_ = local_88[uVar61 + uVar58];
            auVar22._12_4_ = local_88[uVar58 + uVar52];
            auVar90 = divps(auVar73,auVar22);
            fVar72 = *(float *)((long)pvVar54 + uVar58 * 4 + lVar49 * 3);
            fVar74 = *(float *)((long)pvVar54 + uVar58 * 4 + lVar49 * 2);
            fVar75 = *(float *)((long)pvVar54 + uVar58 * 4 + lVar49);
            pfVar68 = (float *)((long)local_288.data +
                               (long)local_288.w *
                               CONCAT44(local_288.elemsize._4_4_,(undefined4)local_288.elemsize) *
                               uVar58);
            *pfVar68 = *(float *)((long)pvVar54 + uVar58 * 4) + auVar90._0_4_ + auVar88._0_4_;
            pfVar68[1] = fVar75 + auVar90._4_4_ + auVar88._4_4_;
            pfVar68[2] = fVar74 + auVar90._8_4_ + auVar88._8_4_;
            pfVar68[3] = fVar72 + auVar90._12_4_ + auVar88._12_4_;
            uVar58 = uVar58 + 1;
            pvVar66 = (void *)((long)pvVar66 + lVar59);
            pvVar67 = (void *)((long)pvVar67 + lVar59);
            pvVar60 = (void *)((long)pvVar60 + lVar59);
            pvVar65 = (void *)((long)pvVar65 + lVar59);
            pvVar57 = (void *)((long)pvVar57 + lVar63);
            pvVar62 = (void *)((long)pvVar62 + lVar63);
            pvVar55 = (void *)((long)pvVar55 + lVar63);
            pvVar50 = (void *)((long)pvVar50 + lVar63);
          } while (uVar58 != uVar56);
        }
        pvVar54 = (void *)(local_98->w * lVar48 * local_98->elemsize + (long)local_98->data);
        if (0 < (int)_h) {
          lVar49 = (long)local_288.w;
          lVar48 = CONCAT44(local_288.elemsize._4_4_,(undefined4)local_288.elemsize);
          pvVar65 = cell_state->data;
          pvVar50 = hidden_state->data;
          pfVar68 = (float *)((long)local_288.data + 0xc);
          uVar58 = 0;
          do {
            fVar71 = *pfVar68;
            fVar77 = pfVar68[-2];
            fVar72 = pfVar68[-1];
            fVar74 = expf(-pfVar68[-3]);
            fVar77 = expf(-fVar77);
            fVar72 = expf(-fVar72);
            fVar71 = tanhf(fVar71);
            fVar71 = fVar71 / (fVar74 + 1.0) +
                     *(float *)((long)pvVar65 + uVar58 * 4) / (fVar77 + 1.0);
            fVar77 = tanhf(fVar71);
            fVar77 = fVar77 / (fVar72 + 1.0);
            *(float *)((long)pvVar65 + uVar58 * 4) = fVar71;
            pvVar55 = pvVar47;
            if (_w_00 == _h) {
              *(float *)((long)pvVar50 + uVar58 * 4) = fVar77;
              pvVar55 = pvVar54;
            }
            *(float *)((long)pvVar55 + uVar58 * 4) = fVar77;
            uVar58 = uVar58 + 1;
            pfVar68 = (float *)((long)pfVar68 + lVar49 * lVar48);
          } while (uVar56 != uVar58);
        }
        if (0 < (int)_w_00 && _w_00 != _h) {
          iVar69 = weight_hr->w;
          sVar21 = weight_hr->elemsize;
          pvVar47 = weight_hr->data;
          pvVar65 = hidden_state->data;
          uVar58 = 0;
          do {
            fVar71 = 0.0;
            if (0 < (int)_h) {
              uVar64 = 0;
              do {
                fVar71 = fVar71 + *(float *)((long)pvVar47 + uVar64 * 4) *
                                  *(float *)((long)local_1e8.data + uVar64 * 4);
                uVar64 = uVar64 + 1;
              } while (uVar56 != uVar64);
            }
            *(float *)((long)pvVar65 + uVar58 * 4) = fVar71;
            *(float *)((long)pvVar54 + uVar58 * 4) = fVar71;
            uVar58 = uVar58 + 1;
            pvVar47 = (void *)((long)pvVar47 + (long)iVar69 * sVar21);
          } while (uVar58 != uVar51);
        }
        uVar46 = (int)local_90 + 1;
        uVar58 = (ulong)uVar46;
      } while (uVar46 != (uint)local_a0);
    }
    piVar43 = (int *)CONCAT44(local_198.refcount._4_4_,local_198.refcount._0_4_);
    if (piVar43 != (int *)0x0) {
      LOCK();
      *piVar43 = *piVar43 + -1;
      UNLOCK();
      if (*piVar43 == 0) {
        if (local_198.allocator == (Allocator *)0x0) {
          if ((float *)local_198.data != (float *)0x0) {
            free(local_198.data);
          }
        }
        else {
          (*(local_198.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    local_198.cstep = 0;
    local_198.data = (void *)0x0;
    local_198.refcount._0_4_ = 0;
    local_198.refcount._4_4_ = 0;
    local_198.elemsize._0_4_ = 0;
    local_198._20_8_ = 0;
    local_198.dims = 0;
    local_198.w = 0;
    local_198.h = 0;
    local_198.d = 0;
    local_198.c = 0;
    piVar43 = (int *)CONCAT44(local_238.refcount._4_4_,local_238.refcount._0_4_);
    if (piVar43 != (int *)0x0) {
      LOCK();
      *piVar43 = *piVar43 + -1;
      UNLOCK();
      if (*piVar43 == 0) {
        if (local_238.allocator == (Allocator *)0x0) {
          if (local_238.data != (void *)0x0) {
            free(local_238.data);
          }
        }
        else {
          (*(local_238.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    local_238.cstep = 0;
    local_238.data = (void *)0x0;
    local_238.refcount._0_4_ = 0;
    local_238.refcount._4_4_ = 0;
    local_238.elemsize._0_4_ = 0;
    local_238.elemsize._4_4_ = 0;
    local_238.elempack = 0;
    local_238.dims = 0;
    local_238.w = 0;
    local_238.h = 0;
    local_238.d = 0;
    local_238.c = 0;
    piVar43 = (int *)CONCAT44(local_f8.refcount._4_4_,local_f8.refcount._0_4_);
    if (piVar43 != (int *)0x0) {
      LOCK();
      *piVar43 = *piVar43 + -1;
      UNLOCK();
      if (*piVar43 == 0) {
        if (local_f8.allocator == (Allocator *)0x0) {
          if (local_f8.data != (void *)0x0) {
            free(local_f8.data);
          }
        }
        else {
          (*(local_f8.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    local_f8.cstep = 0;
    local_f8.data = (void *)0x0;
    local_f8.refcount._0_4_ = 0;
    local_f8.refcount._4_4_ = 0;
    local_f8.elemsize._0_4_ = 0;
    local_f8._20_8_ = 0;
    local_f8.dims = 0;
    local_f8.w = 0;
    local_f8.h = 0;
    local_f8.d = 0;
    local_f8.c = 0;
    piVar43 = (int *)CONCAT44(local_148.refcount._4_4_,local_148.refcount._0_4_);
    if (piVar43 != (int *)0x0) {
      LOCK();
      *piVar43 = *piVar43 + -1;
      UNLOCK();
      if (*piVar43 == 0) {
        if (local_148.allocator == (Allocator *)0x0) {
          if (local_148.data != (void *)0x0) {
            free(local_148.data);
          }
        }
        else {
          (*(local_148.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    local_148.cstep = 0;
    local_148.data = (void *)0x0;
    local_148.refcount._0_4_ = 0;
    local_148.refcount._4_4_ = 0;
    local_148.elemsize._0_4_ = 0;
    local_148.elemsize._4_4_ = 0;
    local_148.elempack = 0;
    local_148.dims = 0;
    local_148.w = 0;
    local_148.h = 0;
    local_148.d = 0;
    local_148.c = 0;
    iVar69 = 0;
  }
  else {
    Mat::create(&local_1e8,_h,4,opt->workspace_allocator);
    iVar69 = -100;
    if ((local_1e8.data != (void *)0x0) && ((long)local_1e8.c * local_1e8.cstep != 0))
    goto LAB_00374087;
  }
  piVar43 = (int *)CONCAT44(local_1e8.refcount._4_4_,local_1e8.refcount._0_4_);
  if (piVar43 != (int *)0x0) {
    LOCK();
    *piVar43 = *piVar43 + -1;
    UNLOCK();
    if (*piVar43 == 0) {
      if (local_1e8.allocator == (Allocator *)0x0) {
        if (local_1e8.data != (void *)0x0) {
          free(local_1e8.data);
        }
      }
      else {
        (*(local_1e8.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  local_1e8.cstep = 0;
  local_1e8.data = (void *)0x0;
  local_1e8.refcount._0_4_ = 0;
  local_1e8.refcount._4_4_ = 0;
  local_1e8.elemsize._0_4_ = 0;
  local_1e8._20_8_ = 0;
  local_1e8.dims = 0;
  local_1e8.w = 0;
  local_1e8.h = 0;
  local_1e8.d = 0;
  local_1e8.c = 0;
LAB_00374af4:
  piVar43 = (int *)CONCAT44(local_288.refcount._4_4_,local_288.refcount._0_4_);
  if (piVar43 != (int *)0x0) {
    LOCK();
    *piVar43 = *piVar43 + -1;
    UNLOCK();
    if (*piVar43 == 0) {
      if (local_288.allocator == (Allocator *)0x0) {
        if (local_288.data != (void *)0x0) {
          free(local_288.data);
        }
      }
      else {
        (*(local_288.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar69;
}

Assistant:

static int lstm_int8(const Mat& bottom_blob, Mat& top_blob, int reverse, const Mat& weight_xc_int8, const float* weight_xc_int8_scales, const Mat& bias_c, const Mat& weight_hc_int8, const float* weight_hc_int8_scales, const Mat& weight_hr, Mat& hidden_state, Mat& cell_state, const Option& opt)
{
    int size = bottom_blob.w;
    int T = bottom_blob.h;

    int num_output = top_blob.w;
    int hidden_size = cell_state.w;

    // 4 x hidden_size
    Mat gates(4, hidden_size, 4u, opt.workspace_allocator);
    if (gates.empty())
        return -100;

    Mat tmp_hidden_state;
    if (num_output != hidden_size)
    {
        tmp_hidden_state.create(hidden_size, 4u, opt.workspace_allocator);
        if (tmp_hidden_state.empty())
            return -100;
    }

    // dynamic quantize bottom_blob
    Mat bottom_blob_int8(size, T, (size_t)1u, 1, opt.workspace_allocator);
    Mat bottom_blob_int8_scales(T, (size_t)4u, 1, opt.workspace_allocator);
    {
        for (int t = 0; t < T; t++)
        {
            const float* x = bottom_blob.row(t);

            float absmax = 0.f;
            for (int i = 0; i < size; i++)
            {
                absmax = std::max(absmax, (float)fabs(x[i]));
            }

            bottom_blob_int8_scales[t] = 127.f / absmax;
        }

        Option opt_quant = opt;
        opt_quant.blob_allocator = opt.workspace_allocator;
        opt_quant.use_packing_layout = false;
        quantize_to_int8(bottom_blob, bottom_blob_int8, bottom_blob_int8_scales, opt_quant);
    }

    Mat hidden_state_int8(num_output, (size_t)1u, 1, opt.workspace_allocator);
    Mat hidden_state_int8_scales(1, (size_t)4u, 1, opt.workspace_allocator);

    // unroll
    for (int t = 0; t < T; t++)
    {
        // clip hidden by continuation indicator
        // h_cont_{t-1} = cont_t * h_{t-1}
        // h_cont_{t-1} = h_{t-1} if cont_t == 1
        //                0       otherwise
        // calculate hidden
        // gate_input_t := W_hc * h_conted_{t-1} + W_xc * x_t + b_c

        int ti = reverse ? T - 1 - t : t;

        // dynamic quantize hidden_state
        {
            float absmax = 0.f;
            for (int i = 0; i < num_output; i++)
            {
                absmax = std::max(absmax, (float)fabs(hidden_state[i]));
            }

            if (absmax == 0.f)
            {
                hidden_state_int8_scales[0] = 1.f;
                hidden_state_int8.fill<signed char>(0);
            }
            else
            {
                hidden_state_int8_scales[0] = 127.f / absmax;

                Option opt_quant = opt;
                opt_quant.blob_allocator = opt.workspace_allocator;
                opt_quant.use_packing_layout = false;
                quantize_to_int8(hidden_state, hidden_state_int8, hidden_state_int8_scales, opt_quant);
            }
        }

        const signed char* x = bottom_blob_int8.row<const signed char>(ti);
        const signed char* hs = hidden_state_int8;
        const float descale_x = 1.f / bottom_blob_int8_scales[ti];
        const float descale_h = 1.f / hidden_state_int8_scales[0];
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < hidden_size; q++)
        {
            const float* bias_c_I = bias_c.row(0);
            const float* bias_c_F = bias_c.row(1);
            const float* bias_c_O = bias_c.row(2);
            const float* bias_c_G = bias_c.row(3);

            float* gates_data = gates.row(q);

            // gate I F O G
            const signed char* weight_xc_int8_I = weight_xc_int8.row<const signed char>(hidden_size * 0 + q);
            const signed char* weight_xc_int8_F = weight_xc_int8.row<const signed char>(hidden_size * 1 + q);
            const signed char* weight_xc_int8_O = weight_xc_int8.row<const signed char>(hidden_size * 2 + q);
            const signed char* weight_xc_int8_G = weight_xc_int8.row<const signed char>(hidden_size * 3 + q);

            const signed char* weight_hc_int8_I = weight_hc_int8.row<const signed char>(hidden_size * 0 + q);
            const signed char* weight_hc_int8_F = weight_hc_int8.row<const signed char>(hidden_size * 1 + q);
            const signed char* weight_hc_int8_O = weight_hc_int8.row<const signed char>(hidden_size * 2 + q);
            const signed char* weight_hc_int8_G = weight_hc_int8.row<const signed char>(hidden_size * 3 + q);

            const float descale_xc_I = 1.f / weight_xc_int8_scales[hidden_size * 0 + q];
            const float descale_xc_F = 1.f / weight_xc_int8_scales[hidden_size * 1 + q];
            const float descale_xc_O = 1.f / weight_xc_int8_scales[hidden_size * 2 + q];
            const float descale_xc_G = 1.f / weight_xc_int8_scales[hidden_size * 3 + q];
            const float descale_hc_I = 1.f / weight_hc_int8_scales[hidden_size * 0 + q];
            const float descale_hc_F = 1.f / weight_hc_int8_scales[hidden_size * 1 + q];
            const float descale_hc_O = 1.f / weight_hc_int8_scales[hidden_size * 2 + q];
            const float descale_hc_G = 1.f / weight_hc_int8_scales[hidden_size * 3 + q];

            int Ix = 0;
            int Fx = 0;
            int Ox = 0;
            int Gx = 0;
            for (int i = 0; i < size; i++)
            {
                signed char xi = x[i];

                Ix += weight_xc_int8_I[i] * xi;
                Fx += weight_xc_int8_F[i] * xi;
                Ox += weight_xc_int8_O[i] * xi;
                Gx += weight_xc_int8_G[i] * xi;
            }

            int Ih = 0;
            int Fh = 0;
            int Oh = 0;
            int Gh = 0;
            for (int i = 0; i < num_output; i++)
            {
                signed char h_cont = hs[i];

                Ih += weight_hc_int8_I[i] * h_cont;
                Fh += weight_hc_int8_F[i] * h_cont;
                Oh += weight_hc_int8_O[i] * h_cont;
                Gh += weight_hc_int8_G[i] * h_cont;
            }

            float I = bias_c_I[q] + Ix * (descale_x * descale_xc_I) + Ih * (descale_h * descale_hc_I);
            float F = bias_c_F[q] + Fx * (descale_x * descale_xc_F) + Fh * (descale_h * descale_hc_F);
            float O = bias_c_O[q] + Ox * (descale_x * descale_xc_O) + Oh * (descale_h * descale_hc_O);
            float G = bias_c_G[q] + Gx * (descale_x * descale_xc_G) + Gh * (descale_h * descale_hc_G);

            gates_data[0] = I;
            gates_data[1] = F;
            gates_data[2] = O;
            gates_data[3] = G;
        }

        // lstm unit
        // sigmoid(I)
        // sigmoid(F)
        // sigmoid(O)
        // tanh(G)
        // c_t := f_t .* c_{t-1} + i_t .* g_t
        // h_t := o_t .* tanh[c_t]
        float* output_data = top_blob.row(ti);
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < hidden_size; q++)
        {
            const float* gates_data = gates.row(q);

            float I = gates_data[0];
            float F = gates_data[1];
            float O = gates_data[2];
            float G = gates_data[3];

            I = 1.f / (1.f + expf(-I));
            F = 1.f / (1.f + expf(-F));
            O = 1.f / (1.f + expf(-O));
            G = tanhf(G);

            float cell2 = F * cell_state[q] + I * G;
            float H = O * tanhf(cell2);
            cell_state[q] = cell2;

            if (num_output == hidden_size)
            {
                hidden_state[q] = H;
                output_data[q] = H;
            }
            else
            {
                tmp_hidden_state[q] = H;
            }
        }

        if (num_output != hidden_size)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < num_output; q++)
            {
                const float* hr = weight_hr.row(q);

                float H = 0;
                for (int i = 0; i < hidden_size; i++)
                {
                    H += tmp_hidden_state[i] * hr[i];
                }

                hidden_state[q] = H;
                output_data[q] = H;
            }
        }
    }

    return 0;
}